

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# event_awaiter.hxx
# Opt level: O3

void __thiscall nuraft::EventAwaiter::invoke(EventAwaiter *this)

{
  bool bVar1;
  unique_lock<std::mutex> l;
  unique_lock<std::mutex> local_28;
  
  LOCK();
  bVar1 = (this->status)._M_i == idle;
  if (bVar1) {
    (this->status)._M_i = done;
  }
  UNLOCK();
  if (!bVar1) {
    local_28._M_device = &this->cvLock;
    local_28._M_owns = false;
    std::unique_lock<std::mutex>::lock(&local_28);
    local_28._M_owns = true;
    LOCK();
    bVar1 = (this->status)._M_i == ready;
    if (bVar1) {
      (this->status)._M_i = done;
    }
    UNLOCK();
    if (!bVar1) {
      std::condition_variable::notify_all();
    }
    std::unique_lock<std::mutex>::~unique_lock(&local_28);
  }
  return;
}

Assistant:

void invoke() {
        AS expected = AS::idle;
        if (status.compare_exchange_strong(expected, AS::done)) {
            // wait() has not been invoked yet, do nothing.
            return;
        }

        std::unique_lock<std::mutex> l(cvLock);
        expected = AS::ready;
        if (status.compare_exchange_strong(expected, AS::done)) {
            // wait() has been called earlier than invoke(),
            // but invoke() has grabbed `cvLock` earlier than wait().
            // Do nothing.
        } else {
            // wait() is waiting for ack.
            cv.notify_all();
        }
    }